

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElimLeibniz.cpp
# Opt level: O1

Clause * __thiscall
Inferences::ElimLeibniz::createConclusion
          (ElimLeibniz *this,Clause *premise,Literal *newLit,Literal *posLit,Literal *negLit,
          RobSubstitution *subst)

{
  Literal ***pppLVar1;
  uint uVar2;
  Self SVar3;
  Literal **ppLVar4;
  Literal *pLVar5;
  Literal **ppLVar6;
  Clause *pCVar7;
  uint uVar8;
  Literal **ppLVar9;
  ulong uVar10;
  RStack<Literal_*> resLits;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_98;
  Literal *local_88;
  RobSubstitution *local_80;
  Literal *local_78;
  GeneratingInference1 local_70;
  Inference local_60;
  
  local_78 = negLit;
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_98);
  local_80 = subst;
  local_88 = Kernel::RobSubstitution::apply(subst,newLit,0);
  uVar8 = *(uint *)&premise->field_0x38 & 0xfffff;
  if (uVar8 != 0) {
    uVar10 = (ulong)(uVar8 != 0);
    ppLVar4 = premise->_literals;
    ppLVar6 = premise->_literals + uVar10;
    do {
      pLVar5 = *ppLVar4;
      if (pLVar5 != local_78 && pLVar5 != posLit) {
        pLVar5 = Kernel::RobSubstitution::apply(local_80,pLVar5,0);
        SVar3._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
             (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                )local_98._self;
        if (*(Literal ***)
             ((long)local_98._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10) == *(Literal ***)
                       ((long)local_98._self._M_t.
                              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                              _M_head_impl + 0x18)) {
          ::Lib::Stack<Kernel::Literal_*>::expand
                    ((Stack<Kernel::Literal_*> *)
                     local_98._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
        }
        **(Literal ***)
          ((long)SVar3._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10)
             = pLVar5;
        pppLVar1 = (Literal ***)
                   ((long)SVar3._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10);
        *pppLVar1 = *pppLVar1 + 1;
      }
      uVar2 = (uint)uVar10;
      ppLVar9 = ppLVar6 + 1;
      if (uVar8 <= uVar2) {
        ppLVar6 = (Literal **)0x0;
      }
      uVar10 = (ulong)(uVar2 + 1);
      ppLVar4 = ppLVar6;
      ppLVar6 = ppLVar9;
    } while (uVar2 < uVar8);
  }
  SVar3._M_t.
  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
       (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
        )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
          )local_98._self;
  if (*(Literal ***)
       ((long)local_98._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) ==
      *(Literal ***)
       ((long)local_98._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x18)) {
    ::Lib::Stack<Kernel::Literal_*>::expand
              ((Stack<Kernel::Literal_*> *)
               local_98._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
  }
  **(Literal ***)
    ((long)SVar3._M_t.
           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
       local_88;
  pppLVar1 = (Literal ***)
             ((long)SVar3._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
             0x10);
  *pppLVar1 = *pppLVar1 + 1;
  local_70.rule = LEIBNIZ_ELIMINATION;
  local_70.premise = premise;
  Kernel::Inference::Inference(&local_60,&local_70);
  pCVar7 = Kernel::Clause::fromStack
                     ((Stack<Kernel::Literal_*> *)
                      local_98._self._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl,
                      &local_60);
  ::Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_98);
  return pCVar7;
}

Assistant:

Clause* ElimLeibniz::createConclusion(Clause* premise, Literal* newLit, 
                                      Literal* posLit, Literal* negLit, RobSubstitution& subst){
  RStack<Literal*> resLits;
  Literal* newLitAfter = subst.apply(newLit, 0);

  for(Literal* curr : premise->iterLits()) {
    if(curr!=posLit && curr!=negLit){
      Literal* currAfter = subst.apply(curr, 0);
      resLits->push(currAfter);
    }
  }
  resLits->push(newLitAfter);
  return Clause::fromStack(*resLits, GeneratingInference1(InferenceRule::LEIBNIZ_ELIMINATION, premise));
}